

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUtil.hpp
# Opt level: O0

char * vkt::tessellation::getTessPrimitiveTypeShaderName(TessPrimitiveType type)

{
  char *pcStack_10;
  TessPrimitiveType type_local;
  
  if (type == TESSPRIMITIVETYPE_TRIANGLES) {
    pcStack_10 = "triangles";
  }
  else if (type == TESSPRIMITIVETYPE_QUADS) {
    pcStack_10 = "quads";
  }
  else if (type == TESSPRIMITIVETYPE_ISOLINES) {
    pcStack_10 = "isolines";
  }
  else {
    pcStack_10 = (char *)0x0;
  }
  return pcStack_10;
}

Assistant:

static inline const char* getTessPrimitiveTypeShaderName (const TessPrimitiveType type)
{
	switch (type)
	{
		case TESSPRIMITIVETYPE_TRIANGLES:	return "triangles";
		case TESSPRIMITIVETYPE_QUADS:		return "quads";
		case TESSPRIMITIVETYPE_ISOLINES:	return "isolines";
		default:
			DE_ASSERT(false);
			return DE_NULL;
	}
}